

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

ZyanStatus ZydisStringAppendShort(ZyanString *destination,ZydisShortString *source)

{
  ZydisShortString *source_local;
  ZyanString *destination_local;
  
  if ((destination == (ZyanString *)0x0) || (source == (ZydisShortString *)0x0)) {
    __assert_fail("destination && source",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0xea,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
    ;
  }
  if ((destination->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!destination->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0xeb,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
    ;
  }
  if (((destination->vector).size != 0) && (source->size != '\0')) {
    if ((destination->vector).capacity < (destination->vector).size + (ulong)source->size) {
      destination_local._4_4_ = 0x80100009;
    }
    else {
      memcpy((void *)((long)(destination->vector).data + ((destination->vector).size - 1)),
             source->data,(ulong)source->size + 1);
      (destination->vector).size = (ulong)source->size + (destination->vector).size;
      if (*(char *)((long)(destination->vector).data + ((destination->vector).size - 1)) != '\0') {
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xf7,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      destination_local._4_4_ = 0x100000;
    }
    return destination_local._4_4_;
  }
  __assert_fail("destination->vector.size && source->size",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                ,0xec,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendShort(ZyanString* destination,
    const ZydisShortString* source)
{
    ZYAN_ASSERT(destination && source);
    ZYAN_ASSERT(!destination->vector.allocator);
    ZYAN_ASSERT(destination->vector.size && source->size);

    if (destination->vector.size + source->size > destination->vector.capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_MEMCPY((char*)destination->vector.data + destination->vector.size - 1, source->data,
        (ZyanUSize)source->size + 1);

    destination->vector.size += source->size;
    ZYDIS_STRING_ASSERT_NULLTERMINATION(destination);

    return ZYAN_STATUS_SUCCESS;
}